

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void openStatTable(Parse *pParse,int iDb,int iStatCur,char *zWhere,char *zWhereType)

{
  sqlite3 *db_00;
  char *zName;
  Vdbe *p;
  Db *pDVar1;
  Table *pTVar2;
  Table *pStat;
  char *zTab;
  u8 aCreateTbl [3];
  int aRoot [3];
  Vdbe *v;
  Db *pDb;
  sqlite3 *db;
  int i;
  char *zWhereType_local;
  char *zWhere_local;
  int iStatCur_local;
  int iDb_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  p = sqlite3GetVdbe(pParse);
  if (p != (Vdbe *)0x0) {
    pDVar1 = db_00->aDb + iDb;
    for (db._4_4_ = 0; db._4_4_ < 3; db._4_4_ = db._4_4_ + 1) {
      zName = openStatTable::aTable[db._4_4_].zName;
      pTVar2 = sqlite3FindTable(db_00,zName,pDVar1->zDbSName);
      if (pTVar2 == (Table *)0x0) {
        if (openStatTable::aTable[db._4_4_].zCols != (char *)0x0) {
          sqlite3NestedParse(pParse,"CREATE TABLE %Q.%s(%s)",pDVar1->zDbSName,zName,
                             openStatTable::aTable[db._4_4_].zCols);
          *(int *)((long)&zTab + (long)db._4_4_ * 4 + 4) = pParse->regRoot;
          *(undefined1 *)((long)&zTab + (long)db._4_4_ + 1) = 0x10;
        }
      }
      else {
        *(int *)((long)&zTab + (long)db._4_4_ * 4 + 4) = pTVar2->tnum;
        *(undefined1 *)((long)&zTab + (long)db._4_4_ + 1) = 0;
        sqlite3TableLock(pParse,iDb,*(int *)((long)&zTab + (long)db._4_4_ * 4 + 4),'\x01',zName);
        if (zWhere == (char *)0x0) {
          sqlite3VdbeAddOp2(p,0x89,*(int *)((long)&zTab + (long)db._4_4_ * 4 + 4),iDb);
        }
        else {
          sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE %s=%Q",pDVar1->zDbSName,zName,
                             zWhereType,zWhere);
        }
      }
    }
    db._4_4_ = 0;
    while (openStatTable::aTable[db._4_4_].zCols != (char *)0x0) {
      sqlite3VdbeAddOp4Int
                (p,0x6d,iStatCur + db._4_4_,*(int *)((long)&zTab + (long)db._4_4_ * 4 + 4),iDb,3);
      sqlite3VdbeChangeP5(p,(ushort)*(byte *)((long)&zTab + (long)db._4_4_ + 1));
      db._4_4_ = db._4_4_ + 1;
    }
  }
  return;
}

Assistant:

static void openStatTable(
  Parse *pParse,          /* Parsing context */
  int iDb,                /* The database we are looking in */
  int iStatCur,           /* Open the sqlite_stat1 table on this cursor */
  const char *zWhere,     /* Delete entries for this table or index */
  const char *zWhereType  /* Either "tbl" or "idx" */
){
  static const struct {
    const char *zName;
    const char *zCols;
  } aTable[] = {
    { "sqlite_stat1", "tbl,idx,stat" },
#if defined(SQLITE_ENABLE_STAT4)
    { "sqlite_stat4", "tbl,idx,neq,nlt,ndlt,sample" },
    { "sqlite_stat3", 0 },
#elif defined(SQLITE_ENABLE_STAT3)
    { "sqlite_stat3", "tbl,idx,neq,nlt,ndlt,sample" },
    { "sqlite_stat4", 0 },
#else
    { "sqlite_stat3", 0 },
    { "sqlite_stat4", 0 },
#endif
  };
  int i;
  sqlite3 *db = pParse->db;
  Db *pDb;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int aRoot[ArraySize(aTable)];
  u8 aCreateTbl[ArraySize(aTable)];

  if( v==0 ) return;
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3VdbeDb(v)==db );
  pDb = &db->aDb[iDb];

  /* Create new statistic tables if they do not exist, or clear them
  ** if they do already exist.
  */
  for(i=0; i<ArraySize(aTable); i++){
    const char *zTab = aTable[i].zName;
    Table *pStat;
    if( (pStat = sqlite3FindTable(db, zTab, pDb->zDbSName))==0 ){
      if( aTable[i].zCols ){
        /* The sqlite_statN table does not exist. Create it. Note that a 
        ** side-effect of the CREATE TABLE statement is to leave the rootpage 
        ** of the new table in register pParse->regRoot. This is important 
        ** because the OpenWrite opcode below will be needing it. */
        sqlite3NestedParse(pParse,
            "CREATE TABLE %Q.%s(%s)", pDb->zDbSName, zTab, aTable[i].zCols
        );
        aRoot[i] = pParse->regRoot;
        aCreateTbl[i] = OPFLAG_P2ISREG;
      }
    }else{
      /* The table already exists. If zWhere is not NULL, delete all entries 
      ** associated with the table zWhere. If zWhere is NULL, delete the
      ** entire contents of the table. */
      aRoot[i] = pStat->tnum;
      aCreateTbl[i] = 0;
      sqlite3TableLock(pParse, iDb, aRoot[i], 1, zTab);
      if( zWhere ){
        sqlite3NestedParse(pParse,
           "DELETE FROM %Q.%s WHERE %s=%Q",
           pDb->zDbSName, zTab, zWhereType, zWhere
        );
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
      }else if( db->xPreUpdateCallback ){
        sqlite3NestedParse(pParse, "DELETE FROM %Q.%s", pDb->zDbSName, zTab);
#endif
      }else{
        /* The sqlite_stat[134] table already exists.  Delete all rows. */
        sqlite3VdbeAddOp2(v, OP_Clear, aRoot[i], iDb);
      }
    }
  }

  /* Open the sqlite_stat[134] tables for writing. */
  for(i=0; aTable[i].zCols; i++){
    assert( i<ArraySize(aTable) );
    sqlite3VdbeAddOp4Int(v, OP_OpenWrite, iStatCur+i, aRoot[i], iDb, 3);
    sqlite3VdbeChangeP5(v, aCreateTbl[i]);
    VdbeComment((v, aTable[i].zName));
  }
}